

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O1

void helper_mtc0_pagegrain_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  ulong uVar1;
  
  env->CP0_PageGrain =
       (arg1 ^ env->CP0_PageGrain) & env->CP0_PageGrain_rw_bitmask ^ env->CP0_PageGrain;
  compute_hflags(env);
  uVar1 = 0xffffffff;
  if ((env->hflags & 0x4000000) != 0) {
    uVar1 = ~(-1L << ((byte)env->PABITS & 0x3f));
  }
  env->PAMask = uVar1;
  return;
}

Assistant:

void helper_mtc0_pagegrain(CPUMIPSState *env, target_ulong arg1)
{
    /* SmartMIPS not implemented */
    /* 1k pages not implemented */
    env->CP0_PageGrain = (arg1 & env->CP0_PageGrain_rw_bitmask) |
                         (env->CP0_PageGrain & ~env->CP0_PageGrain_rw_bitmask);
    compute_hflags(env);
    restore_pamask(env);
}